

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::RuleBasedCollator::setVariableTop
          (RuleBasedCollator *this,uint32_t varTop,UErrorCode *errorCode)

{
  uint uVar1;
  int32_t iVar2;
  CollationSettings *this_00;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  if (this->settings->variableTop != varTop) {
    iVar2 = CollationData::getGroupForPrimary(this->data,varTop);
    if (iVar2 - 0x1004U < 0xfffffffc) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      return;
    }
    varTop = CollationData::getLastPrimaryForGroup(this->data,iVar2);
    if (varTop != this->settings->variableTop) {
      this_00 = SharedObject::copyOnWrite<icu_63::CollationSettings>(&this->settings);
      if (this_00 == (CollationSettings *)0x0) {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
      }
      CollationSettings::setMaxVariable
                (this_00,iVar2 + -0x1000,this->tailoring->settings->options,errorCode);
      if (U_ZERO_ERROR < *errorCode) {
        return;
      }
      this_00->variableTop = varTop;
      iVar2 = CollationFastLatin::getOptions(this->data,this_00,this_00->fastLatinPrimaries,0x180);
      this_00->fastLatinOptions = iVar2;
    }
  }
  if (varTop == this->tailoring->settings->variableTop) {
    uVar1 = this->explicitlySetAttributes & 0xfffffeff;
  }
  else {
    uVar1 = this->explicitlySetAttributes | 0x100;
  }
  this->explicitlySetAttributes = uVar1;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }